

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# currpinf.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::CurrencyPluralInfo::getCurrencyPluralPattern
          (CurrencyPluralInfo *this,UnicodeString *pluralCount,UnicodeString *result)

{
  Hashtable *this_00;
  UnicodeString *this_01;
  int8_t iVar1;
  UnicodeString local_d0;
  ConstChar16Ptr local_90;
  UnicodeString local_88;
  ConstChar16Ptr local_38;
  UnicodeString *local_30;
  UnicodeString *currencyPluralPattern;
  UnicodeString *result_local;
  UnicodeString *pluralCount_local;
  CurrencyPluralInfo *this_local;
  
  currencyPluralPattern = result;
  result_local = pluralCount;
  pluralCount_local = (UnicodeString *)this;
  local_30 = (UnicodeString *)Hashtable::get(this->fPluralCountToCurrencyUnitPattern,pluralCount);
  this_01 = result_local;
  if (local_30 == (UnicodeString *)0x0) {
    ConstChar16Ptr::ConstChar16Ptr(&local_38,(char16_t *)gPluralCountOther);
    iVar1 = UnicodeString::compare(this_01,&local_38,5);
    ConstChar16Ptr::~ConstChar16Ptr(&local_38);
    if (iVar1 != '\0') {
      this_00 = this->fPluralCountToCurrencyUnitPattern;
      ConstChar16Ptr::ConstChar16Ptr(&local_90,(char16_t *)gPluralCountOther);
      UnicodeString::UnicodeString(&local_88,'\x01',&local_90,5);
      local_30 = (UnicodeString *)Hashtable::get(this_00,&local_88);
      UnicodeString::~UnicodeString(&local_88);
      ConstChar16Ptr::~ConstChar16Ptr(&local_90);
    }
    if (local_30 == (UnicodeString *)0x0) {
      UnicodeString::UnicodeString(&local_d0,(UChar *)gDefaultCurrencyPluralPattern);
      UnicodeString::operator=(currencyPluralPattern,&local_d0);
      UnicodeString::~UnicodeString(&local_d0);
      return currencyPluralPattern;
    }
  }
  UnicodeString::operator=(currencyPluralPattern,local_30);
  return currencyPluralPattern;
}

Assistant:

UnicodeString&
CurrencyPluralInfo::getCurrencyPluralPattern(const UnicodeString&  pluralCount,
                                             UnicodeString& result) const {
    const UnicodeString* currencyPluralPattern = 
        (UnicodeString*)fPluralCountToCurrencyUnitPattern->get(pluralCount);
    if (currencyPluralPattern == nullptr) {
        // fall back to "other"
        if (pluralCount.compare(gPluralCountOther, 5)) {
            currencyPluralPattern = 
                (UnicodeString*)fPluralCountToCurrencyUnitPattern->get(UnicodeString(TRUE, gPluralCountOther, 5));
        }
        if (currencyPluralPattern == nullptr) {
            // no currencyUnitPatterns defined, 
            // fallback to predefined default.
            // This should never happen when ICU resource files are
            // available, since currencyUnitPattern of "other" is always
            // defined in root.
            result = UnicodeString(gDefaultCurrencyPluralPattern);
            return result;
        }
    }
    result = *currencyPluralPattern;
    return result;
}